

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Window * sqlite3WindowAssemble
                   (Parse *pParse,Window *pWin,ExprList *pPartition,ExprList *pOrderBy,Token *pBase)

{
  char *pcVar1;
  Token *pBase_local;
  ExprList *pOrderBy_local;
  ExprList *pPartition_local;
  Window *pWin_local;
  Parse *pParse_local;
  
  if (pWin == (Window *)0x0) {
    sqlite3ExprListDelete(pParse->db,pPartition);
    sqlite3ExprListDelete(pParse->db,pOrderBy);
  }
  else {
    pWin->pPartition = pPartition;
    pWin->pOrderBy = pOrderBy;
    if (pBase != (Token *)0x0) {
      pcVar1 = sqlite3DbStrNDup(pParse->db,pBase->z,(ulong)pBase->n);
      pWin->zBase = pcVar1;
    }
  }
  return pWin;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowAssemble(
  Parse *pParse, 
  Window *pWin, 
  ExprList *pPartition, 
  ExprList *pOrderBy, 
  Token *pBase
){
  if( pWin ){
    pWin->pPartition = pPartition;
    pWin->pOrderBy = pOrderBy;
    if( pBase ){
      pWin->zBase = sqlite3DbStrNDup(pParse->db, pBase->z, pBase->n);
    }
  }else{
    sqlite3ExprListDelete(pParse->db, pPartition);
    sqlite3ExprListDelete(pParse->db, pOrderBy);
  }
  return pWin;
}